

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::_InternalParse
          (TreeEnsembleParameters_TreeNode *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *msg;
  uint64_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  char cVar3;
  uint32_t tag;
  double *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = (double *)ptr;
LAB_0024dcac:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_48);
    if (bVar1) {
      return (char *)local_48;
    }
    local_48 = (double *)google::protobuf::internal::ReadTag((char *)local_48,&local_3c,0);
    tag_00 = local_3c;
    cVar3 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar3 != '\b') break;
      uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_48);
      this->treeid_ = uVar2;
      goto joined_r0x0024de31;
    case 2:
      if (cVar3 == '\x10') {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_48);
        this->nodeid_ = uVar2;
        goto joined_r0x0024de31;
      }
      break;
    case 3:
      if (cVar3 == '\x18') {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_48);
        if (local_48 == (double *)0x0) {
          return (char *)0x0;
        }
        this->nodebehavior_ = (int)uVar2;
        goto LAB_0024dcac;
      }
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
      break;
    case 10:
      if (cVar3 == 'P') {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_48);
        this->branchfeatureindex_ = uVar2;
        goto joined_r0x0024de31;
      }
      break;
    case 0xb:
      if (cVar3 == 'Y') {
        this->branchfeaturevalue_ = *local_48;
LAB_0024dd93:
        local_48 = local_48 + 1;
        goto LAB_0024dcac;
      }
      break;
    case 0xc:
      if (cVar3 == '`') {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_48);
        this->truechildnodeid_ = uVar2;
        goto joined_r0x0024de31;
      }
      break;
    case 0xd:
      if (cVar3 == 'h') {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_48);
        this->falsechildnodeid_ = uVar2;
        goto joined_r0x0024de31;
      }
      break;
    case 0xe:
      if (cVar3 == 'p') {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_48);
        this->missingvaluetrackstruechild_ = uVar2 != 0;
        goto joined_r0x0024de31;
      }
      break;
    case 0x14:
      if (cVar3 == -0x5e) {
        local_48 = (double *)((long)local_48 + -2);
        do {
          local_48 = (double *)((long)local_48 + 2);
          msg = google::protobuf::
                RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>
                ::Add(&this->evaluationinfo_);
          local_48 = (double *)
                     google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,&msg->super_MessageLite,(char *)local_48);
          if (local_48 == (double *)0x0) {
            return (char *)0x0;
          }
        } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (bVar1 = google::protobuf::internal::ExpectTag<162u>((char *)local_48), bVar1));
        goto LAB_0024dcac;
      }
      break;
    default:
      if ((local_3c >> 3 == 0x1e) && (cVar3 == -0xf)) {
        this->relativehitrate_ = *local_48;
        goto LAB_0024dd93;
      }
    }
    if ((local_3c == 0) || ((local_3c & 7) == 4)) {
      if (local_48 == (double *)0x0) {
        return (char *)0x0;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      return (char *)local_48;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>(local_38);
    local_48 = (double *)
               google::protobuf::internal::UnknownFieldParse(tag_00,unknown,(char *)local_48,ctx);
joined_r0x0024de31:
    if (local_48 == (double *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* TreeEnsembleParameters_TreeNode::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint64 treeId = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          treeid_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // uint64 nodeId = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          nodeid_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.TreeEnsembleParameters.TreeNode.TreeNodeBehavior nodeBehavior = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_nodebehavior(static_cast<::CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior>(val));
        } else
          goto handle_unusual;
        continue;
      // uint64 branchFeatureIndex = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 80)) {
          branchfeatureindex_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // double branchFeatureValue = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 89)) {
          branchfeaturevalue_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // uint64 trueChildNodeId = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 96)) {
          truechildnodeid_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // uint64 falseChildNodeId = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 104)) {
          falsechildnodeid_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool missingValueTracksTrueChild = 14;
      case 14:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 112)) {
          missingvaluetrackstruechild_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo evaluationInfo = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_evaluationinfo(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<162>(ptr));
        } else
          goto handle_unusual;
        continue;
      // double relativeHitRate = 30;
      case 30:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 241)) {
          relativehitrate_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}